

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

function<void_(UdpSocket_*,_void_*)> * __thiscall
UdpSocketImpl::BindFuncBytesReceived
          (function<void_(UdpSocket_*,_void_*)> *__return_storage_ptr__,UdpSocketImpl *this,
          function<void_(UdpSocket_*,_void_*)> *fBytesReceived)

{
  function<void_(UdpSocket_*,_void_*)> *fBytesReceived_local;
  UdpSocketImpl *this_local;
  
  std::function<void_(UdpSocket_*,_void_*)>::swap(&this->m_fBytesReceivedParam,fBytesReceived);
  std::function<void_(UdpSocket_*,_void_*)>::function(__return_storage_ptr__,fBytesReceived);
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*, void*)> UdpSocketImpl::BindFuncBytesReceived(function<void(UdpSocket*, void*)> fBytesReceived) noexcept
{
    m_fBytesReceivedParam.swap(fBytesReceived);
    return fBytesReceived;
}